

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O2

void gf_25519_mul(gf_25519_s *cs,gf_25519_s *as,gf_25519_s *bs)

{
  word_t *pwVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  word_t *pwVar10;
  word_t *b;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  __uint128_t accum0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  word_t *local_78;
  word_t *local_70;
  word_t *local_68;
  gf_25519_s *local_60;
  word_t *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  uVar12 = as->limb[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = bs->limb[0];
  local_88 = auVar2 * auVar6;
  local_68 = bs->limb + 1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = bs->limb[1];
  local_98 = auVar3 * auVar7;
  local_70 = bs->limb + 2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = bs->limb[2];
  local_48 = auVar4 * auVar8;
  uVar14 = as->limb[1];
  local_60 = cs;
  mac_rm((__uint128_t *)local_48,uVar14,local_68);
  mac_rm((__uint128_t *)local_98,uVar14,bs->limb);
  pwVar1 = bs->limb + 4;
  mac_rm((__uint128_t *)local_88,uVar14 * 0x13,pwVar1);
  uVar14 = as->limb[2];
  mac_rm((__uint128_t *)local_48,uVar14,bs->limb);
  uVar14 = uVar14 * 0x13;
  local_78 = bs->limb + 3;
  mac_rm((__uint128_t *)local_88,uVar14,local_78);
  local_58 = pwVar1;
  mac_rm((__uint128_t *)local_98,uVar14,pwVar1);
  b = local_70;
  uVar14 = as->limb[3] * 0x13;
  mac_rm((__uint128_t *)local_88,uVar14,local_70);
  pwVar10 = local_78;
  mac_rm((__uint128_t *)local_98,uVar14,local_78);
  mac_rm((__uint128_t *)local_48,uVar14,pwVar1);
  uVar14 = as->limb[4] * 0x13;
  mac_rm((__uint128_t *)local_88,uVar14,local_68);
  mac_rm((__uint128_t *)local_98,uVar14,b);
  mac_rm((__uint128_t *)local_48,uVar14,pwVar10);
  uVar12 = local_88._8_8_ << 0xd | (ulong)local_88._0_8_ >> 0x33;
  local_50 = local_88._0_8_ & 0x7ffffffffffff;
  uVar13 = uVar12 + local_98._0_8_;
  uVar12 = (local_98._8_8_ + (ulong)CARRY8(uVar12,local_98._0_8_)) * 0x2000 | uVar13 >> 0x33;
  uVar11 = uVar12 + local_48._0_8_;
  local_60->limb[2] = uVar11 & 0x7ffffffffffff;
  local_88._8_8_ = 0;
  local_88._0_8_ = (local_48._8_8_ + (ulong)CARRY8(uVar12,local_48._0_8_)) * 0x2000 | uVar11 >> 0x33
  ;
  mac_rm((__uint128_t *)local_88,uVar14,local_58);
  uVar12 = as->limb[0];
  mac_rm((__uint128_t *)local_88,uVar12,pwVar10);
  pwVar1 = local_70;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar12;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = bs->limb[4];
  local_98 = auVar5 * auVar9;
  uVar14 = as->limb[1];
  mac_rm((__uint128_t *)local_88,uVar14,local_70);
  mac_rm((__uint128_t *)local_98,uVar14,local_78);
  pwVar10 = local_68;
  uVar14 = as->limb[2];
  mac_rm((__uint128_t *)local_88,uVar14,local_68);
  mac_rm((__uint128_t *)local_98,uVar14,pwVar1);
  uVar14 = as->limb[3];
  mac_rm((__uint128_t *)local_88,uVar14,bs->limb);
  mac_rm((__uint128_t *)local_98,uVar14,pwVar10);
  mac_rm((__uint128_t *)local_98,as->limb[4],bs->limb);
  uVar12 = local_88._8_8_ << 0xd | (ulong)local_88._0_8_ >> 0x33;
  uVar11 = uVar12 + local_98._0_8_;
  local_60->limb[3] = local_88._0_8_ & 0x7ffffffffffff;
  local_60->limb[4] = uVar11 & 0x7ffffffffffff;
  local_50 = ((local_98._8_8_ + (ulong)CARRY8(uVar12,local_98._0_8_)) * 0x2000 | uVar11 >> 0x33) *
             0x13 + local_50;
  local_60->limb[0] = local_50 & 0x7ffffffffffff;
  local_60->limb[1] = (uVar13 & 0x7ffffffffffff) + (local_50 >> 0x33);
  return;
}

Assistant:

void gf_mul (gf_s *__restrict__ cs, const gf as, const gf bs) {
    const uint64_t *a = as->limb, *b = bs->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;
    
    __uint128_t accum0, accum1, accum2;
    
    uint64_t ai = a[0];
    accum0 = widemul_rm(ai, &b[0]);
    accum1 = widemul_rm(ai, &b[1]);
    accum2 = widemul_rm(ai, &b[2]);
    
    ai = a[1];
    mac_rm(&accum2, ai, &b[1]);
    mac_rm(&accum1, ai, &b[0]);
    ai *= 19;
    mac_rm(&accum0, ai, &b[4]);
    
    ai = a[2];
    mac_rm(&accum2, ai, &b[0]);
    ai *= 19;
    mac_rm(&accum0, ai, &b[3]);
    mac_rm(&accum1, ai, &b[4]);
    
    ai = a[3] * 19;
    mac_rm(&accum0, ai, &b[2]);
    mac_rm(&accum1, ai, &b[3]);
    mac_rm(&accum2, ai, &b[4]);
    
    ai = a[4] * 19;
    mac_rm(&accum0, ai, &b[1]);
    mac_rm(&accum1, ai, &b[2]);
    mac_rm(&accum2, ai, &b[3]);
    
    uint64_t c0 = accum0 & mask;
    accum1 += shrld(accum0, 51);
    uint64_t c1 = accum1 & mask;
    accum2 += shrld(accum1, 51);
    c[2] = accum2 & mask;
    
    accum0 = shrld(accum2, 51);

    mac_rm(&accum0, ai, &b[4]);
    
    ai = a[0];
    mac_rm(&accum0, ai, &b[3]);
    accum1 = widemul_rm(ai, &b[4]);
    
    ai = a[1];
    mac_rm(&accum0, ai, &b[2]);
    mac_rm(&accum1, ai, &b[3]);
    
    ai = a[2];
    mac_rm(&accum0, ai, &b[1]);
    mac_rm(&accum1, ai, &b[2]);
    
    ai = a[3];
    mac_rm(&accum0, ai, &b[0]);
    mac_rm(&accum1, ai, &b[1]);
    
    ai = a[4];
    mac_rm(&accum1, ai, &b[0]);
    /* Here accum1 < 5*(9*2^51)^2 */
    
    c[3] = accum0 & mask;
    accum1 += shrld(accum0, 51);
    c[4] = accum1 & mask;
    
    uint64_t a1 = shrld(accum1,51);
    /* Here a1 < (5*(9*2^51)^2 + small) >> 51 = 405 * 2^51 + small
     * a1 * 19 + c0 < (405*19+1)*2^51 + small < 2^13 * 2^51.
     */
    accum1 = a1 * 19 + c0;
    c[0] = accum1 & mask;
    c[1] = c1 + (accum1>>51);
}